

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O2

int ReconstructUV(VP8EncIterator *it,VP8ModeScore *rd,uint8_t *yuv_out,int mode)

{
  uint8_t *puVar1;
  VP8EncIterator *pVVar2;
  int8_t *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  VP8Matrix *pVVar7;
  VP8Encoder *pVVar8;
  VP8EncIterator **ppVVar9;
  ulong uVar11;
  int16_t *piVar12;
  int16_t (*paiVar13) [16];
  uint16_t *puVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  VP8EncIterator *local_178;
  VP8Encoder *local_170;
  VP8SegmentInfo *local_168;
  VP8ModeScore *local_160;
  uint8_t *local_158;
  int8_t *local_150;
  VP8Matrix *local_148;
  uint8_t *local_140;
  int16_t tmp [8] [16];
  VP8EncIterator **ppVVar10;
  
  ppVVar9 = &local_178;
  ppVVar10 = &local_178;
  puVar1 = it->yuv_in_;
  local_170 = it->enc_;
  local_158 = it->yuv_p_ + VP8UVModeOffsets[mode];
  uVar16 = *(byte *)it->mb_ >> 5 & 3;
  paiVar13 = tmp;
  puVar14 = VP8ScanUV;
  local_178 = it;
  local_160 = rd;
  local_140 = yuv_out;
  for (uVar11 = 0; pVVar2 = local_178, uVar11 < 8; uVar11 = uVar11 + 2) {
    (*VP8FTransform2)(puVar1 + (ulong)*puVar14 + 0x10,local_158 + *puVar14,*paiVar13);
    paiVar13 = paiVar13 + 2;
    puVar14 = puVar14 + 2;
  }
  local_168 = local_170->dqm_ + uVar16;
  if (local_178->top_derr_ != (DError *)0x0) {
    pVVar7 = &local_170->dqm_[uVar16].uv_;
    pVVar8 = (VP8Encoder *)(local_160->derr[0] + 2);
    local_150 = local_178->top_derr_[local_178->x_][0] + 1;
    lVar17 = 0;
    local_148 = pVVar7;
    for (lVar15 = 0; piVar3 = local_150, lVar15 != 0x100; lVar15 = lVar15 + 0x80) {
      piVar12 = (int16_t *)((long)tmp[0] + lVar15);
      *piVar12 = *piVar12 +
                 (short)((uint)(int)(short)(local_150[lVar17 + -1] * 7 +
                                           pVVar2->left_derr_[0][lVar17] * 8) >> 3);
      local_170 = pVVar8;
      iVar4 = QuantizeSingle(piVar12,pVVar7);
      piVar12 = (int16_t *)((long)tmp[1] + lVar15);
      *piVar12 = *piVar12 + (short)((uint)(piVar3[lVar17] * 7) >> 3) + (short)iVar4;
      iVar5 = QuantizeSingle(piVar12,pVVar7);
      piVar12 = (int16_t *)((long)tmp[2] + lVar15);
      *piVar12 = *piVar12 +
                 (short)((uint)(iVar4 * 7) >> 3) + (short)pVVar2->left_derr_[0][lVar17 + 1];
      iVar4 = QuantizeSingle(piVar12,pVVar7);
      piVar12 = (int16_t *)((long)tmp[3] + lVar15);
      *piVar12 = *piVar12 + (short)((uint)(iVar5 * 7) >> 3) + (short)iVar4;
      iVar6 = QuantizeSingle(piVar12,pVVar7);
      *(char *)((long)&local_170[-1].top_derr_ + 6) = (char)iVar5;
      *(char *)((long)&local_170[-1].top_derr_ + 7) = (char)iVar4;
      *(int8_t *)&local_170->config_ = (int8_t)iVar6;
      pVVar8 = (VP8Encoder *)((long)&local_170->config_ + 3);
      lVar17 = lVar17 + 2;
    }
  }
  paiVar13 = local_160->uv_levels;
  pVVar7 = &local_168->uv_;
  uVar16 = 0;
  for (uVar11 = 0; ppVVar9 = (VP8EncIterator **)((long)ppVVar9 + 0x40), uVar11 < 8;
      uVar11 = uVar11 + 2) {
    iVar4 = (*VP8EncQuantize2Blocks)((int16_t *)ppVVar9,*paiVar13,pVVar7);
    uVar16 = uVar16 | iVar4 << ((byte)uVar11 & 0x1f);
    paiVar13 = paiVar13 + 2;
  }
  puVar14 = VP8ScanUV;
  for (uVar11 = 0; ppVVar10 = (VP8EncIterator **)((long)ppVVar10 + 0x40), uVar11 < 8;
      uVar11 = uVar11 + 2) {
    (*VP8ITransform)(local_158 + *puVar14,(int16_t *)ppVVar10,local_140 + *puVar14,1);
    puVar14 = puVar14 + 2;
  }
  return uVar16 << 0x10;
}

Assistant:

static int ReconstructUV(VP8EncIterator* WEBP_RESTRICT const it,
                         VP8ModeScore* WEBP_RESTRICT const rd,
                         uint8_t* WEBP_RESTRICT const yuv_out, int mode) {
  const VP8Encoder* const enc = it->enc_;
  const uint8_t* const ref = it->yuv_p_ + VP8UVModeOffsets[mode];
  const uint8_t* const src = it->yuv_in_ + U_OFF_ENC;
  const VP8SegmentInfo* const dqm = &enc->dqm_[it->mb_->segment_];
  int nz = 0;
  int n;
  int16_t tmp[8][16];

  for (n = 0; n < 8; n += 2) {
    VP8FTransform2(src + VP8ScanUV[n], ref + VP8ScanUV[n], tmp[n]);
  }
  if (it->top_derr_ != NULL) CorrectDCValues(it, &dqm->uv_, tmp, rd);

  if (DO_TRELLIS_UV && it->do_trellis_) {
    int ch, x, y;
    for (ch = 0, n = 0; ch <= 2; ch += 2) {
      for (y = 0; y < 2; ++y) {
        for (x = 0; x < 2; ++x, ++n) {
          const int ctx = it->top_nz_[4 + ch + x] + it->left_nz_[4 + ch + y];
          const int non_zero = TrellisQuantizeBlock(
              enc, tmp[n], rd->uv_levels[n], ctx, TYPE_CHROMA_A, &dqm->uv_,
              dqm->lambda_trellis_uv_);
          it->top_nz_[4 + ch + x] = it->left_nz_[4 + ch + y] = non_zero;
          nz |= non_zero << n;
        }
      }
    }
  } else {
    for (n = 0; n < 8; n += 2) {
      nz |= VP8EncQuantize2Blocks(tmp[n], rd->uv_levels[n], &dqm->uv_) << n;
    }
  }

  for (n = 0; n < 8; n += 2) {
    VP8ITransform(ref + VP8ScanUV[n], tmp[n], yuv_out + VP8ScanUV[n], 1);
  }
  return (nz << 16);
}